

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_CustomPrinterForMessageContent_Test::TestBody
          (TextFormatTest_CustomPrinterForMessageContent_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypes_NestedMessage> *this_00;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *this_01;
  ImportMessage *pIVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>_>
  *pVVar2;
  FastFieldValuePrinter *printer_00;
  char *message_00;
  AssertHelper AStack_408;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_400;
  CustomMessageContentFieldValuePrinter my_field_printer;
  AssertionResult gtest_ar;
  string text;
  Printer printer;
  TestAllTypes message;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message);
  proto2_unittest::TestAllTypes::mutable_optional_nested_message(&message);
  pIVar1 = proto2_unittest::TestAllTypes::mutable_optional_import_message(&message);
  (pIVar1->field_0)._impl_.d_ = 0x2a;
  *(byte *)&pIVar1->field_0 = *(byte *)&pIVar1->field_0 | 1;
  this_00 = &message.field_0._impl_.repeated_nested_message_;
  internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
            (&this_00->super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes_NestedMessage>>
            (&this_00->super_RepeatedPtrFieldBase);
  this_01 = &message.field_0._impl_.repeated_import_message_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                     (&this_01->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.d_ = 0x2b;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest_import::ImportMessage>>
                     (&this_01->super_RepeatedPtrFieldBase);
  (pVVar2->field_0)._impl_.d_ = 0x2c;
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  TextFormat::Printer::Printer(&printer);
  CustomMessageContentFieldValuePrinter::CustomMessageContentFieldValuePrinter(&my_field_printer);
  printer_00 = (FastFieldValuePrinter *)operator_new(8);
  printer_00->_vptr_FastFieldValuePrinter = (_func_int **)0x0;
  CustomMessageContentFieldValuePrinter::CustomMessageContentFieldValuePrinter
            ((CustomMessageContentFieldValuePrinter *)printer_00);
  TextFormat::Printer::SetDefaultFieldValuePrinter(&printer,printer_00);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_local_buf[0] = '\0';
  TextFormat::Printer::PrintToString(&printer,&message.super_Message,&text);
  testing::internal::CmpHelperEQ<char[235],std::__cxx11::string>
            ((internal *)&gtest_ar,
             "\"optional_nested_message {\\n\" \"}\\n\" \"optional_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_nested_message {\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\" \"repeated_import_message {\\n\" \"  # REDACTED, 2 bytes\\n\" \"}\\n\""
             ,"text",(char (*) [235])
                     "optional_nested_message {\n}\noptional_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_nested_message {\n}\nrepeated_nested_message {\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\nrepeated_import_message {\n  # REDACTED, 2 bytes\n}\n"
             ,&text);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_400);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message_00 = anon_var_dwarf_651463 + 5;
    }
    else {
      message_00 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format_unittest.cc"
               ,800,message_00);
    testing::internal::AssertHelper::operator=(&AStack_408,(Message *)&local_400);
    testing::internal::AssertHelper::~AssertHelper(&AStack_408);
    if (local_400._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_400._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&text);
  TextFormat::FastFieldValuePrinter::~FastFieldValuePrinter
            (&my_field_printer.super_FastFieldValuePrinter);
  TextFormat::Printer::~Printer(&printer);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message);
  return;
}

Assistant:

TEST_F(TextFormatTest, CustomPrinterForMessageContent) {
  proto2_unittest::TestAllTypes message;
  message.mutable_optional_nested_message();
  message.mutable_optional_import_message()->set_d(42);
  message.add_repeated_nested_message();
  message.add_repeated_nested_message();
  message.add_repeated_import_message()->set_d(43);
  message.add_repeated_import_message()->set_d(44);
  TextFormat::Printer printer;
  CustomMessageContentFieldValuePrinter my_field_printer;
  printer.SetDefaultFieldValuePrinter(
      new CustomMessageContentFieldValuePrinter());
  std::string text;
  printer.PrintToString(message, &text);
  EXPECT_EQ(
      "optional_nested_message {\n"
      "}\n"
      "optional_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_nested_message {\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n"
      "repeated_import_message {\n"
      "  # REDACTED, 2 bytes\n"
      "}\n",
      text);
}